

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleZomby.cpp
# Opt level: O3

void __thiscall SimpleZomby::Zomby::~Zomby(Zomby *this)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_t sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  char *pcVar6;
  ostringstream buf;
  _func_int **local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  _Atomic_word _Stack_1b0;
  _Atomic_word _Stack_1ac;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  long local_198 [14];
  ios_base local_128 [264];
  
  LOCK();
  (this->_semaphore)._M_base._M_i = false;
  UNLOCK();
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::detach();
  }
  if ((this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    pcVar6 = *(char **)((this->super_Manager)._vptr_Manager[-1] + 8);
    pcVar6 = pcVar6 + (*pcVar6 == '*');
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"::",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"~Zomby",6);
    std::ios::widen((char)(ostream *)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
    std::ostream::put((char)local_198);
    std::ostream::flush();
    peVar2 = (this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__cxx11::stringbuf::str();
    local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    local_1a0->_M_use_count = 1;
    local_1a0->_M_weak_count = 1;
    local_1a0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00106ca0;
    local_1a8 = local_1a0 + 1;
    p_Var5 = local_1a0 + 2;
    local_1a0[1]._vptr__Sp_counted_base = (_func_int **)p_Var5;
    if (local_1c8 == (_func_int **)&local_1b8) {
      *(uint *)&p_Var5->_vptr__Sp_counted_base = local_1b8;
      *(undefined4 *)((long)&local_1a0[2]._vptr__Sp_counted_base + 4) = uStack_1b4;
      local_1a0[2]._M_use_count = _Stack_1b0;
      local_1a0[2]._M_weak_count = _Stack_1ac;
    }
    else {
      local_1a8->_vptr__Sp_counted_base = local_1c8;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)CONCAT44(uStack_1b4,local_1b8);
    }
    local_1a0[1]._M_use_count = (undefined4)local_1c0;
    local_1a0[1]._M_weak_count = local_1c0._4_4_;
    local_1b8 = local_1b8 & 0xffffff00;
    (*peVar2->_vptr_Listener[2])(peVar2);
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  if ((this->_thread)._M_id._M_thread != 0) {
    std::terminate();
  }
  p_Var5 = (this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->super_enable_shared_from_this<SimpleZomby::Zomby>)._M_weak_this.
           super___weak_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

Zomby::~Zomby()
{
    _semaphore = false;

    if (_thread.joinable()) {
        _thread.detach();
    }

    if (_listener) {
        std::ostringstream buf;
        buf << typeid(*this).name() << "::" << __func__ << std::endl;
        _listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
    }
}